

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_restart.c
# Opt level: O1

cupdlp_bool PDHG_Check_Restart_Merit_Function(CUPDLPwork *work)

{
  CUPDLPresobj *pCVar1;
  
  pCVar1 = work->resobj;
  if (ABS(pCVar1->dDualityGapAverage) + ABS(pCVar1->dDualityGapAverage) < ABS(pCVar1->dDualityGap))
  {
    return pCVar1->dPrimalFeasAverage + pCVar1->dPrimalFeasAverage < pCVar1->dPrimalFeas;
  }
  return false;
}

Assistant:

cupdlp_bool PDHG_Check_Restart_Merit_Function(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;
  CUPDLPresobj *resobj = work->resobj;

  return (
      (fabs(resobj->dDualityGap) > 2.0 * fabs(resobj->dDualityGapAverage)) &&
      (resobj->dPrimalFeas > 2.0 * resobj->dPrimalFeasAverage));
}